

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint __thiscall
ON_SubDMeshFragmentIterator::TotalQuadCount(ON_SubDMeshFragmentIterator *this,uint mesh_density)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar1 = ClampMeshDensity(this,mesh_density);
  uVar2 = FragmentCount(this);
  uVar5 = uVar2;
  if (uVar2 != 0) {
    uVar2 = this->m_full_size_fragment_count;
    uVar5 = this->m_half_size_fragment_count;
  }
  iVar6 = (1 << ((byte)uVar1 & 0x1f)) << ((byte)uVar1 & 0x1f);
  if (6 < uVar1) {
    iVar6 = 0;
  }
  bVar3 = (byte)(uVar1 - 1);
  iVar4 = (1 << (bVar3 & 0x1f)) << (bVar3 & 0x1f);
  if (5 < uVar1 - 1) {
    iVar4 = 0;
  }
  return iVar4 * uVar5 + iVar6 * uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::TotalQuadCount(
  unsigned int mesh_density
  ) const
{
  mesh_density = ClampMeshDensity(mesh_density);
  unsigned int full_size_fragment_count = 0;
  unsigned int half_size_fragment_count = 0;
  ON_SubDMeshFragmentIterator::GetFragmentCounts(full_size_fragment_count, half_size_fragment_count);
  const unsigned int full_size_quad_count = ON_SubDMeshFragment::FullFragmentMeshQuadCountFromDensity(mesh_density);
  const unsigned int half_size_quad_count = ON_SubDMeshFragment::HalfFragmentMeshQuadCountFromDensity(mesh_density);
  return full_size_fragment_count * full_size_quad_count + half_size_fragment_count * half_size_quad_count;
}